

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

double units::detail::power_const<double>(double val,int power)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double local_40;
  double local_38;
  double local_28;
  double local_20;
  undefined8 in_stack_ffffffffffffffe8;
  int power_00;
  undefined4 in_stack_fffffffffffffff0;
  
  power_00 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (in_EDI < 2) {
    if (in_EDI < -1) {
      dVar1 = power_const<double>((double)CONCAT44(in_EDI,in_stack_fffffffffffffff0),power_00);
      dVar1 = sqr_power<double>(dVar1);
      local_38 = in_XMM0_Qa;
      if (-in_EDI % 2 == 0) {
        local_38 = 1.0;
      }
      local_40 = 1.0 / (dVar1 * local_38);
    }
    else {
      local_40 = power_const_small<double>(in_XMM0_Qa,in_EDI);
    }
    local_28 = local_40;
  }
  else {
    dVar1 = power_const<double>((double)CONCAT44(in_EDI,in_stack_fffffffffffffff0),power_00);
    local_28 = sqr_power<double>(dVar1);
    local_20 = in_XMM0_Qa;
    if (in_EDI % 2 == 0) {
      local_20 = 1.0;
    }
    local_28 = local_28 * local_20;
  }
  return local_28;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }